

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cst_controller.cpp
# Opt level: O0

void __thiscall r_exec::CSTOverlay::CSTOverlay(CSTOverlay *this,CSTOverlay *original)

{
  Controller *c;
  HLPBindingMap *bindings;
  CSTOverlay *original_local;
  CSTOverlay *this_local;
  
  c = (original->super_HLPOverlay).super_Overlay.controller;
  bindings = core::P::operator_cast_to_HLPBindingMap_((P *)&(original->super_HLPOverlay).bindings);
  HLPOverlay::HLPOverlay(&this->super_HLPOverlay,c,bindings);
  (this->super_HLPOverlay).super_Overlay.super__Object._vptr__Object =
       (_func_int **)&PTR__CSTOverlay_002ea4b8;
  std::vector<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>::vector
            (&this->inputs);
  std::
  unordered_set<core::P<r_exec::_Fact>,_r_code::PHash<r_exec::_Fact>,_std::equal_to<core::P<r_exec::_Fact>_>,_std::allocator<core::P<r_exec::_Fact>_>_>
  ::unordered_set(&this->predictions);
  std::
  unordered_set<core::P<r_exec::Sim>,_r_code::PHash<r_exec::Sim>,_std::equal_to<core::P<r_exec::Sim>_>,_std::allocator<core::P<r_exec::Sim>_>_>
  ::unordered_set(&this->simulations);
  r_code::list<core::P<r_exec::_Fact>_>::operator=
            (&(this->super_HLPOverlay).patterns,&(original->super_HLPOverlay).patterns);
  std::
  unordered_set<core::P<r_exec::_Fact>,_r_code::PHash<r_exec::_Fact>,_std::equal_to<core::P<r_exec::_Fact>_>,_std::allocator<core::P<r_exec::_Fact>_>_>
  ::operator=(&this->predictions,&original->predictions);
  std::
  unordered_set<core::P<r_exec::Sim>,_r_code::PHash<r_exec::Sim>,_std::equal_to<core::P<r_exec::Sim>_>,_std::allocator<core::P<r_exec::Sim>_>_>
  ::operator=(&this->simulations,&original->simulations);
  this->match_deadline = original->match_deadline;
  this->lowest_cfd = original->lowest_cfd;
  return;
}

Assistant:

CSTOverlay::CSTOverlay(const CSTOverlay *original): HLPOverlay(original->controller, original->bindings)
{
    patterns = original->patterns;
    predictions = original->predictions;
    simulations = original->simulations;
    match_deadline = original->match_deadline;
    lowest_cfd = original->lowest_cfd;
}